

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isAllowedInCompilationUnit(SyntaxKind kind)

{
  int in_EDI;
  SyntaxKind in_stack_fffffffffffffff0;
  bool local_1;
  
  if ((((((in_EDI == 0x31) || (in_EDI == 0x60)) || (in_EDI - 0xccU < 2)) ||
       ((in_EDI == 0x103 || (in_EDI == 0x134)))) ||
      ((in_EDI == 0x157 || ((in_EDI == 0x17c || (in_EDI == 0x1d1)))))) || (in_EDI == 0x1df)) {
    local_1 = true;
  }
  else {
    local_1 = isAllowedInPackage(in_stack_fffffffffffffff0);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isAllowedInCompilationUnit(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::BindDirective:
        case SyntaxKind::UdpDeclaration:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
        case SyntaxKind::ConfigDeclaration:
            return true;
        default:
            return isAllowedInPackage(kind);
    }
}